

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gzio.c
# Opt level: O2

int cm_zlib_gzeof(gzFile file)

{
  uint uVar1;
  
  uVar1 = 0;
  if ((file != (gzFile)0x0) && (*(char *)((long)file + 0xac) == 'r')) {
    if (*(int *)((long)file + 0x74) != 0) {
      return 1;
    }
    uVar1 = (uint)(*(int *)((long)file + 0x70) == 1);
  }
  return uVar1;
}

Assistant:

int ZEXPORT gzeof (file)
    gzFile file;
{
    gz_stream *s = (gz_stream*)file;

    /* With concatenated compressed files that can have embedded
     * crc trailers, z_eof is no longer the only/best indicator of EOF
     * on a gz_stream. Handle end-of-stream error explicitly here.
     */
    if (s == NULL || s->mode != 'r') return 0;
    if (s->z_eof) return 1;
    return s->z_err == Z_STREAM_END;
}